

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O1

int areadint(char *file,int **data_ref,int *length_ref)

{
  uint uVar1;
  int __fd;
  ssize_t sVar2;
  int *__buf;
  size_t sVar3;
  ulong uVar4;
  char *__format;
  uint uVar5;
  int length;
  uint local_3c;
  uint *local_38;
  
  __fd = open(file,0,0x1a4);
  if (__fd < 0) {
    fprintf(_stderr,"areadint: %s: can\'t open\n",file);
  }
  else {
    sVar2 = read(__fd,&local_3c,4);
    if (sVar2 == 4) {
      uVar5 = local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
              local_3c << 0x18;
      local_3c = uVar5;
      if (data_ref == (int **)0x0) {
        close(__fd);
        if (length_ref != (int *)0x0) {
          *length_ref = uVar5;
          return uVar5;
        }
        return uVar5;
      }
      uVar1 = uVar5 * 4;
      local_38 = (uint *)length_ref;
      __buf = (int *)malloc((ulong)uVar1);
      if (__buf != (int *)0x0) {
        sVar3 = read(__fd,__buf,(long)(int)uVar1);
        if (sVar3 != (long)(int)uVar1) {
          fprintf(_stderr,"areadint: %s: can\'t read data\n",file);
          close(__fd);
          free(__buf);
          return -1;
        }
        close(__fd);
        *data_ref = __buf;
        if (0 < (int)uVar5) {
          uVar4 = 0;
          do {
            uVar1 = __buf[uVar4];
            __buf[uVar4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                           uVar1 << 0x18;
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
        *local_38 = uVar5;
        return uVar5;
      }
      __format = "areadint: %s: can\'t alloc data\n";
    }
    else {
      __format = "areadint: %s: can\'t read length (empty file?)\n";
    }
    fprintf(_stderr,__format,file);
    close(__fd);
  }
  return -1;
}

Assistant:

int
areadint (char *file,
	  int **data_ref,
	  int *length_ref)
{
  int             fd;
  int             length;
  int             size;
  int             offset;
  char           *data;

  if ((fd = open (file, O_RDONLY | O_BINARY, 0644)) < 0)
  {
    fprintf (stderr, "areadint: %s: can't open\n", file);
    return -1;
  }
  if (read (fd, (char *) &length, 4) != 4)
  {
    fprintf (stderr, "areadint: %s: can't read length (empty file?)\n", file);
    close (fd);
    return -1;
  }
  SWAP_INT32(&length);
  /* Just get the file size if we were not given a buffer. */
  if (data_ref == NULL) {
	  close(fd);
	  if (length_ref)
	    *length_ref = length;
	  return length;
  }
  size = length * sizeof (int);
  if (!(data = malloc ((unsigned) size)))
  {
    fprintf (stderr, "areadint: %s: can't alloc data\n", file);
    close (fd);
    return -1;
  }
  if (read (fd, data, size) != size)
  {
    fprintf (stderr, "areadint: %s: can't read data\n", file);
    close (fd);
    free (data);
    return -1;
  }
  close (fd);
  *data_ref = (int *) data;
  for(offset = 0; offset < length; offset++)
    SWAP_INT32(*data_ref + offset);
  *length_ref = length;
  return length;
}